

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasCoreML6Opsets(Model *model)

{
  bool bVar1;
  Program *pPVar2;
  const_iterator main_iter;
  allocator<char> local_51;
  key_type local_50;
  const_iterator local_30;
  
  if (model->_oneof_case_[0] == 0x1f6) {
    pPVar2 = Specification::Model::mlprogram(model);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"main",&local_51);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::find(&local_30,&(pPVar2->functions_).map_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Specification::Model::mlprogram(model);
    if ((local_30.it_.node_ != (Node *)0x0) &&
       (bVar1 = std::operator==(((((local_30.it_.node_)->kv).v_)->second).opset_.ptr_,"CoreML6"),
       bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CoreML::hasCoreML6Opsets(const Specification::Model& model) {
    if (model.Type_case() == Specification::Model::kMlProgram) {
        auto main_iter = model.mlprogram().functions().find("main");
        if (main_iter != model.mlprogram().functions().end()) {
            const auto& main = main_iter->second;
            if (main.opset() == "CoreML6") {
                return true;
            }
        }
    }
    return false;
}